

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O0

int vardata_validate(vardata *data)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint32_t *puVar4;
  int k_3;
  int k_2;
  int p;
  int k_1;
  int l;
  int k;
  int j;
  int i;
  int res;
  vardata *data_local;
  
  j = 0;
  if (data->validated == 0) {
    data->validated = 1;
    for (k = 0; k < data->featuresnum; k = k + 1) {
      puVar4 = mask_new(data->featuresnum);
      data->features[k].ifmask = puVar4;
      puVar4 = mask_new(data->featuresnum);
      data->features[k].cfmask = puVar4;
      mask_set(data->features[k].ifmask,k);
    }
    for (k = 0; k < data->variantsnum; k = k + 1) {
      puVar4 = mask_new(data->featuresnum);
      data->variants[k].fmask = puVar4;
    }
    for (k = 0; k < data->modesnum; k = k + 1) {
      puVar4 = mask_new(data->featuresnum);
      data->modes[k].rfmask = puVar4;
    }
    for (k = 0; k < data->featuresnum; k = k + 1) {
      for (l = 0; l < data->features[k].impliesnum; l = l + 1) {
        iVar2 = data->features[k].implies[l];
        for (p = 0; p < data->featuresnum; p = p + 1) {
          iVar1 = mask_get(data->features[p].ifmask,k);
          if (iVar1 != 0) {
            mask_or(data->features[p].ifmask,data->features[iVar2].ifmask,data->featuresnum);
          }
        }
      }
    }
    for (k = 0; k < data->featuresnum; k = k + 1) {
      for (l = 0; l < data->features[k].conflictsnum; l = l + 1) {
        iVar2 = data->features[k].conflicts[l];
        mask_set(data->features[k].cfmask,iVar2);
        mask_set(data->features[iVar2].cfmask,k);
      }
    }
    k_3 = 1;
    while (k_3 != 0) {
      k_3 = 0;
      for (k = 0; k < data->featuresnum; k = k + 1) {
        for (l = 0; l < data->featuresnum; l = l + 1) {
          iVar2 = mask_get(data->features[k].ifmask,l);
          if (iVar2 != 0) {
            uVar3 = mask_or_r(data->features[k].cfmask,data->features[l].cfmask,data->featuresnum);
            k_3 = uVar3 | k_3;
          }
        }
      }
    }
    for (k = 0; k < data->featuresnum; k = k + 1) {
      iVar2 = mask_get(data->features[k].cfmask,k);
      if (iVar2 != 0) {
        fprintf(_stderr,"vardata %s: feature %s conflicts with itself!\n",data->name,
                data->features[k].name);
        j = 1;
      }
    }
    for (k = 0; k < data->variantsnum; k = k + 1) {
      for (l = 0; l < data->variants[k].featuresnum; l = l + 1) {
        mask_or(data->variants[k].fmask,data->features[data->variants[k].features[l]].ifmask,
                data->featuresnum);
      }
    }
    for (k = 0; k < data->modesnum; k = k + 1) {
      for (l = 0; l < data->modes[k].rfeaturesnum; l = l + 1) {
        mask_set(data->modes[k].rfmask,data->modes[k].rfeatures[l]);
      }
    }
    return j;
  }
  abort();
}

Assistant:

int vardata_validate(struct vardata *data) {
	int res = 0;
	if (data->validated)
		abort();
	data->validated = 1;
	int i, j;
	for (i = 0; i < data->featuresnum; i++) {
		data->features[i].ifmask = mask_new(data->featuresnum);
		data->features[i].cfmask = mask_new(data->featuresnum);
		mask_set(data->features[i].ifmask, i);
	}
	for (i = 0; i < data->variantsnum; i++) {
		data->variants[i].fmask = mask_new(data->featuresnum);
	}
	for (i = 0; i < data->modesnum; i++) {
		data->modes[i].rfmask = mask_new(data->featuresnum);
	}
	/* implies */
	for (i = 0; i < data->featuresnum; i++) {
		for (j = 0; j < data->features[i].impliesnum; j++) {
			int k = data->features[i].implies[j];
			int l;
			for (l = 0; l < data->featuresnum; l++) {
				if (mask_get(data->features[l].ifmask, i)) {
					mask_or(data->features[l].ifmask, data->features[k].ifmask, data->featuresnum);
				}
			}
		}
	}
	/* conflicts */
	for (i = 0; i < data->featuresnum; i++) {
		for (j = 0; j < data->features[i].conflictsnum; j++) {
			int k = data->features[i].conflicts[j];
			mask_set(data->features[i].cfmask, k);
			mask_set(data->features[k].cfmask, i);
		}
	}
	int p = 1;
	while (p) {
		p = 0;
		for (i = 0; i < data->featuresnum; i++) {
			for (j = 0; j < data->featuresnum; j++) {
				if (mask_get(data->features[i].ifmask, j)) {
					p |= mask_or_r(data->features[i].cfmask, data->features[j].cfmask, data->featuresnum);
				}
			}
		}
	}
	for (i = 0; i < data->featuresnum; i++) {
		if (mask_get(data->features[i].cfmask, i)) {
			fprintf(stderr, "vardata %s: feature %s conflicts with itself!\n", data->name, data->features[i].name);
			res = 1;
		}
	}
	/* variants */
	for (i = 0; i < data->variantsnum; i++) {
		for (j = 0; j < data->variants[i].featuresnum; j++) {
			int k = data->variants[i].features[j];
			mask_or(data->variants[i].fmask, data->features[k].ifmask, data->featuresnum);
		}
	}
	/* variants */
	for (i = 0; i < data->modesnum; i++) {
		for (j = 0; j < data->modes[i].rfeaturesnum; j++) {
			int k = data->modes[i].rfeatures[j];
			mask_set(data->modes[i].rfmask, k);
		}
	}
	return res;
}